

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::PlasticMaterial::writeTo(PlasticMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  int32_t local_54;
  SP local_50;
  SP local_40;
  SP local_30;
  SP local_20;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Entity;
  local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_54 = BinaryWriter::serialize(binary,&local_20);
  BinaryWriter::writeRaw(binary,&local_54,4);
  if (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_30.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->map_ks).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Entity;
  local_30.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->map_ks).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_30.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_54 = BinaryWriter::serialize(binary,&local_30);
  BinaryWriter::writeRaw(binary,&local_54,4);
  if (local_30.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  BinaryWriter::writeRaw(binary,&this->kd,0xc);
  BinaryWriter::writeRaw(binary,&this->ks,0xc);
  BinaryWriter::writeRaw(binary,&this->roughness,4);
  BinaryWriter::writeRaw(binary,&this->remapRoughness,1);
  local_40.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->map_roughness).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_Entity;
  local_40.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->map_roughness).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_40.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_40.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_40.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_54 = BinaryWriter::serialize(binary,&local_40);
  BinaryWriter::writeRaw(binary,&local_54,4);
  if (local_40.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_50.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->map_bump).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Entity;
  local_50.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->map_bump).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_50.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_54 = BinaryWriter::serialize(binary,&local_50);
  BinaryWriter::writeRaw(binary,&local_54,4);
  if (local_50.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return 0x15;
}

Assistant:

int PlasticMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(binary.serialize(map_kd));
    binary.write(binary.serialize(map_ks));
    binary.write(kd);
    binary.write(ks);
    binary.write(roughness);
    binary.write(remapRoughness);
    binary.write(binary.serialize(map_roughness));
    binary.write(binary.serialize(map_bump));
    return TYPE_PLASTIC_MATERIAL;
  }